

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::js::api::json::CreateDescriptorKeyRequest::CreateDescriptorKeyRequest
          (CreateDescriptorKeyRequest *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  
  (this->super_JsonClassBase<cfd::js::api::json::CreateDescriptorKeyRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__CreateDescriptorKeyRequest_00b38388;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&this->key_,"",&local_29);
  std::__cxx11::string::string((string *)&this->parent_extkey_,"",&local_2a);
  std::__cxx11::string::string((string *)&this->key_path_from_parent_,"",&local_2b);
  CollectFieldName();
  return;
}

Assistant:

CreateDescriptorKeyRequest() {
    CollectFieldName();
  }